

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcountable.h
# Opt level: O2

void __thiscall
std::
pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::pair(pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *param_1)

{
  Option *pOVar1;
  
  pOVar1 = (param_1->first).ptr_;
  (this->first).ptr_ = pOVar1;
  if (pOVar1 != (Option *)0x0) {
    (pOVar1->super_RefCountable).refCount_ = (pOVar1->super_RefCountable).refCount_ + 1;
  }
  std::__cxx11::string::string((string *)&this->second,(string *)&param_1->second);
  return;
}

Assistant:

IntrusiveSharedPtr(const IntrusiveSharedPtr& o) throw()
		: ptr_(o.ptr_) {
		addRef();
	}